

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O1

void __thiscall
boost::wrapexcept<boost::xpressive::regex_error>::wrapexcept
          (wrapexcept<boost::xpressive::regex_error> *this,regex_error *e,source_location *loc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  error_info_container *peVar3;
  char *pcVar4;
  int iVar5;
  uint_least32_t uVar6;
  undefined1 auVar7 [16];
  
  (this->super_type)._vptr_clone_base = (_func_int **)&PTR___cxa_pure_virtual_001952f8;
  std::runtime_error::runtime_error
            (&(this->super_regex_error).super_runtime_error,&e->super_runtime_error);
  (this->super_regex_error).super_exception._vptr_exception =
       (_func_int **)&PTR___cxa_pure_virtual_00195370;
  peVar3 = (e->super_exception).data_.px_;
  (this->super_regex_error).super_exception.data_.px_ = peVar3;
  if (peVar3 != (error_info_container *)0x0) {
    (**(code **)(*(long *)peVar3 + 0x18))();
  }
  iVar5 = (e->super_exception).throw_column_;
  (this->super_regex_error).super_exception.throw_line_ = (e->super_exception).throw_line_;
  (this->super_regex_error).super_exception.throw_column_ = iVar5;
  pcVar4 = (e->super_exception).throw_file_;
  (this->super_regex_error).super_exception.throw_function_ = (e->super_exception).throw_function_;
  (this->super_regex_error).super_exception.throw_file_ = pcVar4;
  *(undefined ***)&this->super_regex_error = &PTR__regex_error_00195328;
  (this->super_regex_error).super_exception._vptr_exception =
       (_func_int **)&PTR__regex_error_00195350;
  (this->super_regex_error).code_ = e->code_;
  (this->super_type)._vptr_clone_base = (_func_int **)&PTR_clone_00195280;
  *(undefined ***)&this->super_regex_error = &PTR__wrapexcept_001952b0;
  (this->super_regex_error).super_exception._vptr_exception =
       (_func_int **)&PTR__wrapexcept_001952d8;
  copy_from(this,&e->super_exception);
  uVar1 = loc->file_;
  uVar2 = loc->function_;
  auVar7._8_4_ = (int)uVar1;
  auVar7._0_8_ = uVar2;
  auVar7._12_4_ = (int)((ulong)uVar1 >> 0x20);
  (this->super_regex_error).super_exception.throw_function_ = (char *)uVar2;
  (this->super_regex_error).super_exception.throw_file_ = (char *)auVar7._8_8_;
  uVar6 = loc->column_;
  (this->super_regex_error).super_exception.throw_line_ = loc->line_;
  (this->super_regex_error).super_exception.throw_column_ = uVar6;
  return;
}

Assistant:

explicit wrapexcept( E const & e, boost::source_location const & loc ): E( e )
    {
        copy_from( &e );

        set_info( *this, throw_file( loc.file_name() ) );
        set_info( *this, throw_line( static_cast<int>( loc.line() ) ) );
        set_info( *this, throw_function( loc.function_name() ) );
        set_info( *this, throw_column( static_cast<int>( loc.column() ) ) );
    }